

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O3

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  int iVar2;
  char **ppcVar3;
  int iVar4;
  char *pcVar5;
  int iVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  int iVar12;
  size_t sVar13;
  char buffer [32];
  char local_58 [40];
  
  pcVar11 = args->p;
  iVar8 = args->len;
  lVar10 = (long)iVar8;
  args->len = 0;
  s->start = pcVar11;
  if (0 < lVar10) {
    pcVar5 = pcVar11 + lVar10;
    do {
      iVar6 = args->len + 7;
      lVar10 = (long)pcVar11 - lVar10;
      while( true ) {
        lVar10 = lVar10 + 1;
        if (args->max_len <= iVar6) {
          _lws_log(1,"Used up interpret padding\n");
          return -1;
        }
        iVar2 = s->pos;
        if ((long)iVar2 != 0) goto LAB_00135f0d;
        if (*pcVar11 == '$') break;
        args->len = iVar6 + -6;
        pcVar11 = pcVar11 + 1;
        iVar6 = iVar6 + 1;
        if (pcVar5 <= pcVar11) goto LAB_001360b7;
      }
      s->start = pcVar11;
LAB_00135f0d:
      cVar1 = *pcVar11;
      s->pos = iVar2 + 1;
      s->swallow[iVar2] = cVar1;
      iVar6 = s->pos;
      sVar13 = (size_t)iVar6;
      if ((sVar13 == 0xf) || (iVar2 = s->count_vars, (long)iVar2 < 1)) {
LAB_00136009:
        s->swallow[sVar13] = '\0';
        memcpy(s->start,s->swallow,(long)s->pos);
        args->len = args->len + 1;
        s->pos = 0;
        pcVar11 = s->start;
      }
      else {
        ppcVar3 = s->vars;
        uVar7 = 0;
        uVar9 = 0;
        iVar12 = 0;
        do {
          iVar4 = strncmp(s->swallow,ppcVar3[uVar7],sVar13);
          if (iVar4 == 0) {
            uVar9 = uVar7 & 0xffffffff;
          }
          iVar12 = iVar12 + (uint)(iVar4 == 0);
          uVar7 = uVar7 + 1;
        } while ((long)iVar2 != uVar7);
        if (iVar12 == 0) goto LAB_00136009;
        if (iVar12 == 1) {
          sVar13 = strlen(s->vars[(int)uVar9]);
          if (iVar6 == (int)sVar13) {
            pcVar11 = (*s->replace)(s->data,(int)uVar9);
            if (pcVar11 == (char *)0x0) {
              pcVar11 = "NULL";
            }
            sVar13 = strlen(pcVar11);
            s->swallow[s->pos] = '\0';
            iVar6 = (int)sVar13;
            if (s->pos != iVar6) {
              memmove(s->start + iVar6,s->start + s->pos,(long)args->p - lVar10);
              iVar8 = ((iVar8 + iVar6) - s->pos) + 1;
            }
            memcpy(s->start,pcVar11,(long)iVar6);
            args->len = args->len + 1;
            pcVar11 = s->start + 1;
            s->pos = 0;
          }
        }
      }
      pcVar11 = pcVar11 + 1;
      lVar10 = (long)iVar8;
      pcVar5 = args->p + lVar10;
    } while (pcVar11 < pcVar5);
  }
LAB_001360b7:
  if (args->chunked == 0) {
    iVar8 = 0;
  }
  else if ((args->final == 0) || (iVar8 = -1, args->len + 7 < args->max_len)) {
    iVar8 = 0;
    iVar6 = sprintf(local_58,"%X\r\n");
    pcVar11 = args->p;
    sVar13 = (size_t)iVar6;
    args->p = pcVar11 + -sVar13;
    memcpy(pcVar11 + -sVar13,local_58,sVar13);
    iVar6 = args->len;
    lVar10 = (long)iVar6 + sVar13;
    args->len = (int)lVar10;
    iVar2 = args->final;
    pcVar11 = args->p;
    pcVar11[lVar10] = '\r';
    if (iVar2 == 0) {
      pcVar11[lVar10 + 1] = '\n';
      args->len = args->len + 2;
    }
    else {
      builtin_strncpy(pcVar11 + (long)iVar6 + sVar13 + 1,"\n0\r\n\r\n",6);
      args->len = args->len + 7;
    }
  }
  return iVar8;
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						old_len - (sp - args->p) - 1);
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}